

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O3

void __thiscall
foxxll::disk_block_allocator::add_free_region
          (disk_block_allocator *this,uint64_t block_pos,uint64_t block_size)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  bad_ext_alloc *pbVar8;
  iterator __position;
  space_map_type *this_00;
  _Self __tmp;
  mapped_type mVar9;
  iterator pred;
  iterator succ;
  uint64_t region_pos;
  ostringstream msg;
  iterator local_1e8;
  iterator local_1e0;
  uint64_t local_1d8;
  _Base_ptr local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  this_00 = &this->free_space_;
  sVar2 = (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  mVar9 = block_size;
  local_1d8 = block_pos;
  if (sVar2 == 0) goto LAB_00147f65;
  p_Var1 = &(this->free_space_)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __position._M_node = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) <= block_pos])
  {
    if (block_pos < *(ulong *)(p_Var3 + 1)) {
      __position._M_node = p_Var3;
    }
  }
  p_Var3 = (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar4._M_node = __position._M_node;
  local_1e0._M_node = __position._M_node;
  if (__position._M_node != p_Var3) {
    local_1e8._M_node = __position._M_node;
    iVar4._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
  }
  local_1e8._M_node = iVar4._M_node;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
LAB_001480bf:
      deallocation_error(this,block_pos,block_size,&local_1e8,&local_1e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/disk_block_allocator.cpp"
                    ,0x6a,"void foxxll::disk_block_allocator::add_free_region(uint64_t, uint64_t)");
    }
LAB_00147eb5:
    uVar5 = block_size + block_pos;
    if (*(ulong *)(__position._M_node + 1) < uVar5 &&
        block_pos <= *(ulong *)(__position._M_node + 1)) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"disk_block_allocator::check_corruption",0x26);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Error: double deallocation of external memory, trying to deallocate region ",0x4b)
      ;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"  which overlaps empty space [",0x1e);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
      pbVar8 = (bad_ext_alloc *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      bad_ext_alloc::bad_ext_alloc(pbVar8,&local_1c8);
      __cxa_throw(pbVar8,&bad_ext_alloc::typeinfo,std::runtime_error::~runtime_error);
    }
    if (sVar2 == 1) {
      if (*(ulong *)(__position._M_node + 1) != uVar5) goto LAB_00147f65;
      mVar9 = (long)&(__position._M_node[1]._M_parent)->_M_color + block_size;
    }
    else {
      if (*(ulong *)(__position._M_node + 1) == uVar5) {
        mVar9 = (long)&(__position._M_node[1]._M_parent)->_M_color + block_size;
        local_1d0 = iVar4._M_node;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                            *)this_00,__position);
        if (__position._M_node == p_Var3) goto LAB_00147f65;
        local_1e0._M_node = local_1d0;
        iVar4._M_node = local_1d0;
      }
      else if (__position._M_node == p_Var3) goto LAB_00147f65;
      if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
        deallocation_error(this,block_pos,block_size,&local_1e8,&local_1e0);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/disk_block_allocator.cpp"
                      ,0x83,"void foxxll::disk_block_allocator::add_free_region(uint64_t, uint64_t)"
                     );
      }
      if ((long)&(iVar4._M_node[1]._M_parent)->_M_color + *(uint64_t *)(iVar4._M_node + 1) !=
          block_pos) goto LAB_00147f65;
      mVar9 = (long)&(iVar4._M_node[1]._M_parent)->_M_color + mVar9;
      __position._M_node = iVar4._M_node;
      local_1d8 = *(uint64_t *)(iVar4._M_node + 1);
    }
  }
  else {
    if ((*(ulong *)(iVar4._M_node + 1) <= block_pos) &&
       (block_pos < (long)&(iVar4._M_node[1]._M_parent)->_M_color + *(ulong *)(iVar4._M_node + 1)))
    {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"disk_block_allocator::check_corruption",0x26);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Error: double deallocation of external memory, trying to deallocate region ",0x4b)
      ;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," in empty space[",0x10);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," + ",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
      pbVar8 = (bad_ext_alloc *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      bad_ext_alloc::bad_ext_alloc(pbVar8,&local_1c8);
      __cxa_throw(pbVar8,&bad_ext_alloc::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((_Rb_tree_header *)__position._M_node != p_Var1) goto LAB_00147eb5;
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) goto LAB_001480bf;
    if ((long)&(iVar4._M_node[1]._M_parent)->_M_color + *(uint64_t *)(iVar4._M_node + 1) !=
        block_pos) goto LAB_00147f65;
    mVar9 = (long)&(iVar4._M_node[1]._M_parent)->_M_color + block_size;
    __position._M_node = iVar4._M_node;
    local_1d8 = *(uint64_t *)(iVar4._M_node + 1);
  }
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      *)this_00,__position);
LAB_00147f65:
  pmVar6 = std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[](this_00,&local_1d8);
  *pmVar6 = mVar9;
  this->free_bytes_ = this->free_bytes_ + block_size;
  return;
}

Assistant:

void disk_block_allocator::add_free_region(uint64_t block_pos, uint64_t block_size)
{
    TLX_LOG << "Deallocating a block with size: " << block_size << " position: " << block_pos;
    uint64_t region_pos = block_pos;
    uint64_t region_size = block_size;

    // First we try to find adjacent free slots and if successful we coalesce them
    // During this procedure we also identify double-frees and similar issues
    if (!free_space_.empty())
    {
        auto succ = free_space_.upper_bound(region_pos);
        auto pred = succ;

        if (pred != free_space_.begin())
            pred--;

        if (pred != free_space_.end()) {
            if (pred->first <= region_pos && (pred->first + pred->second) > region_pos) {
                FOXXLL_THROW2(
                    bad_ext_alloc, "disk_block_allocator::check_corruption",
                    "Error: double deallocation of external memory, trying to deallocate "
                    "region " << region_pos << " + " << region_size << " in empty space"
                        "[" << pred->first << " + " << pred->second << "]"
                );
            }
        }

        if (succ != free_space_.end()) {
            if (region_pos <= succ->first && (region_pos + region_size) > succ->first) {
                FOXXLL_THROW2(
                    bad_ext_alloc, "disk_block_allocator::check_corruption",
                    "Error: double deallocation of external memory, trying to deallocate "
                    "region " << region_pos << " + " << region_size << "  which overlaps empty space "
                        "[" << succ->first << " + " << succ->second << "]"
                );
            }
        }

        if (succ == free_space_.end()) {
            if (pred == free_space_.end()) {
                deallocation_error(block_pos, block_size, pred, succ);
                assert(false);
            }
            else if ((*pred).first + (*pred).second == region_pos) {
                // coalesce with predecessor
                region_size += (*pred).second;
                region_pos = (*pred).first;
                free_space_.erase(pred);
            }
        }
        else {
            if (free_space_.size() > 1) {
                // check it now, as succ may change!
                const bool succ_is_not_the_first = (succ != free_space_.begin());

                if ((*succ).first == region_pos + region_size) {
                    // coalesce with successor
                    region_size += (*succ).second;
                    free_space_.erase(succ);
                    if (succ_is_not_the_first)
                        succ = pred;
                }

                if (succ_is_not_the_first) {
                    if (pred == free_space_.end()) {
                        deallocation_error(block_pos, block_size, pred, succ);
                        assert(false);
                    }
                    else if ((*pred).first + (*pred).second == region_pos) {
                        // coalesce with predecessor
                        region_size += (*pred).second;
                        region_pos = (*pred).first;
                        free_space_.erase(pred);
                    }
                }
            }
            else {
                if ((*succ).first == region_pos + region_size) {
                    // coalesce with successor
                    region_size += (*succ).second;
                    free_space_.erase(succ);
                }
            }
        }
    }

    free_space_[region_pos] = region_size;
    free_bytes_ += block_size;
}